

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O0

void Rwr_CutIsBoolean_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLeaves,int fMarkA)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int fMarkA_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Vec_PtrFind(vLeaves,pObj);
  if (iVar1 < 0) {
    pAVar2 = Abc_ObjNot(pObj);
    iVar1 = Vec_PtrFind(vLeaves,pAVar2);
    if (iVar1 < 0) {
      iVar1 = Abc_ObjIsCi(pObj);
      if (iVar1 == 0) {
        pAVar2 = Abc_ObjFanin0(pObj);
        Rwr_CutIsBoolean_rec(pAVar2,vLeaves,fMarkA);
        pAVar2 = Abc_ObjFanin1(pObj);
        Rwr_CutIsBoolean_rec(pAVar2,vLeaves,fMarkA);
        return;
      }
      __assert_fail("!Abc_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwr/rwrEva.c"
                    ,0x16b,"void Rwr_CutIsBoolean_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
  }
  if (fMarkA == 0) {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffdf | 0x20;
  }
  else {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffef | 0x10;
  }
  return;
}

Assistant:

void Rwr_CutIsBoolean_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLeaves, int fMarkA )
{
    if ( Vec_PtrFind(vLeaves, pObj) >= 0 || Vec_PtrFind(vLeaves, Abc_ObjNot(pObj)) >= 0 )
    {
        if ( fMarkA )
            pObj->fMarkA = 1;
        else
            pObj->fMarkB = 1;
        return;
    }
    assert( !Abc_ObjIsCi(pObj) );
    Rwr_CutIsBoolean_rec( Abc_ObjFanin0(pObj), vLeaves, fMarkA );
    Rwr_CutIsBoolean_rec( Abc_ObjFanin1(pObj), vLeaves, fMarkA );
}